

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O2

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalJoin *join,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  pointer *this_01;
  JoinType type;
  byte bVar1;
  pointer pCVar2;
  bool bVar3;
  bool bVar4;
  type new_stats;
  reference pvVar5;
  pointer pLVar6;
  LogicalAnyJoin *join_00;
  iterator iVar7;
  pointer pBVar8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *node_ptr_00;
  ColumnBinding *binding;
  ulong __n;
  pointer pCVar9;
  StatisticsPropagator *this_02;
  vector<duckdb::ColumnBinding,_true> left_bindings;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_48;
  
  this_00 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             *)(node_ptr + 2);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::get<true>(this_00,0);
  PropagateStatistics((StatisticsPropagator *)&left_bindings,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)join);
  pCVar2 = left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
           .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_01 = &(join->super_LogicalOperator).types.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
        this_01,(pointer)pCVar2);
  ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
              &left_bindings);
  for (__n = 1; __n < (ulong)((long)node_ptr[3].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl -
                              (long)node_ptr[2].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl >> 3); __n = __n + 1) {
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::get<true>(this_00,__n);
    PropagateStatistics((StatisticsPropagator *)&left_bindings,
                        (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                         *)join);
    if (left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      right_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
      reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *
            )this_01,(pointer)0x0);
      ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
                   *)&right_bindings);
    }
    else if (*this_01 != (pointer)0x0) {
      this_02 = (StatisticsPropagator *)&left_bindings;
      new_stats = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                  ::operator*((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                               *)&left_bindings);
      MultiplyCardinalities
                (this_02,(unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                          *)this_01,new_stats);
    }
    ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
                &left_bindings);
  }
  type = *(JoinType *)
          ((long)&node_ptr[0xc].
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 1);
  bVar3 = IsRightOuterJoin(type);
  bVar4 = IsLeftOuterJoin(type);
  left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  right_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  right_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  right_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar3) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(this_00,0);
    pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar5);
    (*pLVar6->_vptr_LogicalOperator[2])(&local_48,pLVar6);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
              (&left_bindings.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &local_48);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_48);
  }
  bVar4 = type == SINGLE || bVar4;
  if (bVar4) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(this_00,1);
    pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar5);
    (*pLVar6->_vptr_LogicalOperator[2])(&local_48,pLVar6);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
              (&right_bindings.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &local_48);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_48);
  }
  bVar1 = *(byte *)&node_ptr[1].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (1 < bVar1 - 0x33) {
    if (bVar1 == 0x35) {
      join_00 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)join,join_00,node_ptr_00);
      goto LAB_01a7ce3d;
    }
    if (bVar1 != 0x38) goto LAB_01a7ce3d;
  }
  PropagateStatistics((StatisticsPropagator *)join,(LogicalComparisonJoin *)node_ptr,in_RCX);
LAB_01a7ce3d:
  pCVar2 = right_bindings.
           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (bVar4) {
    for (pCVar9 = right_bindings.
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                  _M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(join->super_LogicalOperator).children.
                         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pCVar9);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pBVar8 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                        ._M_cur + 0x18));
        BaseStatistics::Set(pBVar8,CAN_HAVE_NULL_VALUES);
      }
    }
  }
  pCVar2 = left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
           .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    for (pCVar9 = left_bindings.
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                  _M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(join->super_LogicalOperator).children.
                         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pCVar9);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pBVar8 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                        ._M_cur + 0x18));
        BaseStatistics::Set(pBVar8,CAN_HAVE_NULL_VALUES);
      }
    }
  }
  this->optimizer = (Optimizer *)*this_01;
  *this_01 = (pointer)0x0;
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &right_bindings);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &left_bindings);
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalJoin &join,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// first propagate through the children of the join
	node_stats = PropagateStatistics(join.children[0]);
	for (idx_t child_idx = 1; child_idx < join.children.size(); child_idx++) {
		auto child_stats = PropagateStatistics(join.children[child_idx]);
		if (!child_stats) {
			node_stats = nullptr;
		} else if (node_stats) {
			MultiplyCardinalities(node_stats, *child_stats);
		}
	}

	auto join_type = join.join_type;
	// depending on the join type, we might need to alter the statistics
	// LEFT, FULL, RIGHT OUTER and SINGLE joins can introduce null values
	// this requires us to alter the statistics after this point in the query plan
	bool adds_null_on_left = IsRightOuterJoin(join_type);
	bool adds_null_on_right = IsLeftOuterJoin(join_type) || join_type == JoinType::SINGLE;

	vector<ColumnBinding> left_bindings, right_bindings;
	if (adds_null_on_left) {
		left_bindings = join.children[0]->GetColumnBindings();
	}
	if (adds_null_on_right) {
		right_bindings = join.children[1]->GetColumnBindings();
	}

	// then propagate into the join conditions
	switch (join.type) {
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		PropagateStatistics(join.Cast<LogicalComparisonJoin>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
		PropagateStatistics(join.Cast<LogicalAnyJoin>(), node_ptr);
		break;
	default:
		break;
	}

	if (adds_null_on_right) {
		// left or full outer join: set IsNull() to true for all rhs statistics
		for (auto &binding : right_bindings) {
			auto stats = statistics_map.find(binding);
			if (stats != statistics_map.end()) {
				stats->second->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
			}
		}
	}
	if (adds_null_on_left) {
		// right or full outer join: set IsNull() to true for all lhs statistics
		for (auto &binding : left_bindings) {
			auto stats = statistics_map.find(binding);
			if (stats != statistics_map.end()) {
				stats->second->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
			}
		}
	}
	return std::move(node_stats);
}